

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O1

void __thiscall HPrimal::primalChooseRow(HPrimal *this)

{
  HVector *this_00;
  int iVar1;
  int iVar2;
  HModel *pHVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  pHVar3 = this->model;
  pdVar4 = (pHVar3->baseLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (pHVar3->baseUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pHVar3->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar17 = pHVar3->dblOption[1];
  this_00 = &this->column;
  HVector::clear(this_00);
  (this->column).packFlag = true;
  HMatrix::collect_aj(&this->model->matrix,this_00,this->columnIn,1.0);
  HFactor::ftran(&this->model->factor,this_00,this->columnDensity);
  iVar1 = (this->column).count;
  lVar9 = (long)iVar1;
  if (this->countUpdate < 10) {
    dVar12 = 1e-09;
  }
  else {
    dVar12 = *(double *)(&DAT_00159590 + (ulong)(this->countUpdate < 0x14) * 8);
  }
  this->columnDensity = this->columnDensity * 0.95 + ((double)iVar1 * 0.05) / (double)this->numRow;
  this->rowOut = -1;
  dVar13 = (double)(this->model->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start[this->columnIn];
  if (lVar9 < 1) {
    dVar14 = 1e+100;
  }
  else {
    dVar14 = 1e+100;
    lVar10 = 0;
    do {
      iVar2 = (this->column).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      dVar15 = (this->column).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2] * dVar13;
      if (dVar15 <= dVar12) {
        if (dVar15 < -dVar12) {
          dVar16 = (pdVar6[iVar2] - pdVar5[iVar2]) - dVar17;
          uVar11 = -(ulong)(dVar14 * dVar15 < dVar16);
          dVar14 = (double)(~uVar11 & (ulong)dVar14 | (ulong)(dVar16 / dVar15) & uVar11);
        }
      }
      else {
        dVar16 = (pdVar6[iVar2] - pdVar4[iVar2]) + dVar17;
        uVar11 = -(ulong)(dVar16 < dVar14 * dVar15);
        dVar14 = (double)(~uVar11 & (ulong)dVar14 | (ulong)(dVar16 / dVar15) & uVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  if (0 < iVar1) {
    piVar7 = (this->column).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->column).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar17 = 0.0;
    lVar10 = 0;
    do {
      iVar1 = piVar7[lVar10];
      dVar15 = pdVar8[iVar1] * dVar13;
      if (dVar15 <= dVar12) {
        if ((dVar15 < -dVar12) && (dVar14 * dVar15 < pdVar6[iVar1] - pdVar5[iVar1])) {
          dVar15 = -dVar15;
          goto LAB_00132bf4;
        }
      }
      else if (pdVar6[iVar1] - pdVar4[iVar1] < dVar14 * dVar15) {
LAB_00132bf4:
        if (dVar17 < dVar15) {
          this->rowOut = iVar1;
          dVar17 = dVar15;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  return;
}

Assistant:

void HPrimal::primalChooseRow() {
    const double *baseLower = model->getBaseLower();
    const double *baseUpper = model->getBaseUpper();
    double *baseValue = model->getBaseValue();
    const double primalTolerance = model->dblOption[DBLOPT_PRIMAL_TOL];

    // Compute pivot column
    column.clear();
    column.packFlag = true;
    model->getMatrix()->collect_aj(column, columnIn, 1);
    model->getFactor()->ftran(column, columnDensity);
    columnDensity = 0.95 * columnDensity + 0.05 * column.count / numRow;

    // Initialize
    rowOut = -1;

    // Choose column pass 1
    double alphaTol = countUpdate < 10 ? 1e-9 : countUpdate < 20 ? 1e-8 : 1e-7;
    const int *jMove = model->getNonbasicMove();
    int moveIn = jMove[columnIn];
    if (moveIn == 0) {
        // If there's still free in the N
        // We would report not-solved
        // Need to handle free
    }
    double relaxTheta = 1e100;
    for (int i = 0; i < column.count; i++) {
        int index = column.index[i];
        double alpha = column.array[index] * moveIn;
        if (alpha > alphaTol) {
            double relaxSpace = baseValue[index] - baseLower[index]
                    + primalTolerance;
            if (relaxSpace < relaxTheta * alpha)
                relaxTheta = relaxSpace / alpha;
        } else if (alpha < -alphaTol) {
            double relaxSpace = baseValue[index] - baseUpper[index]
                    - primalTolerance;
            if (relaxSpace > relaxTheta * alpha)
                relaxTheta = relaxSpace / alpha;
        }
    }

    // Choose column pass 2
    double bestAlpha = 0;
    for (int i = 0; i < column.count; i++) {
        int index = column.index[i];
        double alpha = column.array[index] * moveIn;
        if (alpha > alphaTol) {
            double tightSpace = baseValue[index] - baseLower[index];
            if (tightSpace < relaxTheta * alpha) {
                if (bestAlpha < alpha) {
                    bestAlpha = alpha;
                    rowOut = index;
                }
            }
        } else if (alpha < -alphaTol) {
            double tightSpace = baseValue[index] - baseUpper[index];
            if (tightSpace > relaxTheta * alpha) {
                if (bestAlpha < -alpha) {
                    bestAlpha = -alpha;
                    rowOut = index;
                }
            }
        }
    }

}